

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q5.cpp
# Opt level: O1

pair<char,_char> sum(char c1,char c2,char carry)

{
  short sVar1;
  int iVar2;
  int iVar3;
  undefined3 in_register_00000031;
  int iVar4;
  undefined7 in_register_00000039;
  bool bVar5;
  
  bVar5 = carry == '1';
  iVar4 = (int)CONCAT71(in_register_00000039,c1) + CONCAT31(in_register_00000031,c2);
  iVar2 = (uint)bVar5 + iVar4;
  iVar3 = iVar2 + -0x60;
  sVar1 = bVar5 - 0x3a;
  if (SBORROW4(iVar3,10) != iVar2 + -0x6a < 0) {
    sVar1 = bVar5 - 0x30;
  }
  return (pair<char,_char>)(iVar3 < 10 ^ 0x31 | (sVar1 + (short)iVar4) * 0x100);
}

Assistant:

std::pair<char, char> sum(const char c1, const char c2, const char carry){
  // distances from offset char
  auto dc1             {distance(c1)};
  auto dc2             {distance(c2)};
  // sum of distances
  auto int_sum         {dc1 + dc2};
  // sum of distances considering carry
  auto carried_int_sum {carry == '1' ? int_sum + 1 : int_sum};
    
  // if sum with carry is at most nine, carry '0'
  if (carried_int_sum <= 9){
    return {'0', base_digit + carried_int_sum};
  }
  // otherwise, carry '1' and subtract ten to obtain result digit
  else{
    return {'1', base_digit + carried_int_sum - 10};
  }
}